

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffasfm(char *tform,int *dtcode,long *twidth,int *decimals,int *status)

{
  size_t sVar1;
  undefined4 *in_RCX;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *in_R8;
  char message [81];
  char temp [71];
  char *form;
  float fwidth;
  long width;
  long longval;
  int datacode;
  int ii;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 uVar2;
  char local_108 [80];
  int *in_stack_ffffffffffffff48;
  long *in_stack_ffffffffffffff50;
  char in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff59;
  char *local_58;
  float local_4c;
  int *in_stack_ffffffffffffffb8;
  float *in_stack_ffffffffffffffc0;
  int iVar3;
  int iVar4;
  int local_4;
  
  if (*in_R8 < 1) {
    if (in_RSI != (int *)0x0) {
      *in_RSI = 0;
    }
    if (in_RDX != (long *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = 0;
    }
    iVar4 = 0;
    while( true ) {
      uVar2 = false;
      if (*(char *)(in_RDI + iVar4) != '\0') {
        uVar2 = *(char *)(in_RDI + iVar4) == ' ';
      }
      if ((bool)uVar2 == false) break;
      iVar4 = iVar4 + 1;
    }
    sVar1 = strlen((char *)(in_RDI + iVar4));
    if (sVar1 < 0x47) {
      strcpy(&stack0xffffffffffffff58,(char *)(in_RDI + iVar4));
      ffupch((char *)CONCAT17(uVar2,in_stack_fffffffffffffef0));
      if (in_stack_ffffffffffffff58 == '\0') {
        ffpmsg((char *)0x166b9b);
        *in_R8 = 0x105;
        local_4 = 0x105;
      }
      else {
        if (in_stack_ffffffffffffff58 == 'A') {
          iVar3 = 0x10;
        }
        else if (in_stack_ffffffffffffff58 == 'I') {
          iVar3 = 0x29;
        }
        else if (in_stack_ffffffffffffff58 == 'F') {
          iVar3 = 0x2a;
        }
        else if (in_stack_ffffffffffffff58 == 'E') {
          iVar3 = 0x2a;
        }
        else {
          if (in_stack_ffffffffffffff58 != 'D') {
            snprintf(local_108,0x51,"Illegal ASCII table TFORMn datatype: \'%s\'",in_RDI);
            ffpmsg((char *)0x166c7d);
            *in_R8 = 0x106;
            return 0x106;
          }
          iVar3 = 0x52;
        }
        if (in_RSI != (int *)0x0) {
          *in_RSI = iVar3;
        }
        if ((iVar3 == 0x10) || (iVar3 == 0x29)) {
          iVar4 = ffc2ii((char *)CONCAT71(in_stack_ffffffffffffff59,in_stack_ffffffffffffff58),
                         in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          if (iVar4 < 1) {
            if ((long)in_stack_ffffffffffffffb8 < 1) {
              in_stack_ffffffffffffffb8 = (int *)0x0;
              *in_R8 = 0x105;
            }
            else if (((long)in_stack_ffffffffffffffb8 < 5) && (iVar3 == 0x29)) {
              iVar3 = 0x15;
            }
          }
        }
        else {
          iVar4 = ffc2rr((char *)CONCAT44(iVar4,iVar3),in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
          if (iVar4 < 1) {
            if (0.0 < local_4c) {
              in_stack_ffffffffffffffb8 = (int *)(long)local_4c;
              if ((7 < (long)in_stack_ffffffffffffffb8) && (in_stack_ffffffffffffff58 == 'F')) {
                iVar3 = 0x52;
              }
              if ((long)in_stack_ffffffffffffffb8 < 10) {
                local_58 = &stack0xffffffffffffff5a;
              }
              else {
                local_58 = &stack0xffffffffffffff5b;
              }
              if ((*local_58 == '.') &&
                 (iVar4 = ffc2ii((char *)CONCAT71(in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58),
                                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48), iVar4 < 1)) {
                if (in_RCX != (undefined4 *)0x0) {
                  *in_RCX = (int)in_stack_ffffffffffffffc0;
                }
                if ((long)in_stack_ffffffffffffffb8 <= (long)in_stack_ffffffffffffffc0) {
                  *in_R8 = 0x105;
                }
                if ((6 < (long)in_stack_ffffffffffffffc0) && (in_stack_ffffffffffffff58 == 'E')) {
                  iVar3 = 0x52;
                }
              }
            }
            else {
              *in_R8 = 0x105;
            }
          }
        }
        if (0 < *in_R8) {
          *in_R8 = 0x105;
          snprintf(local_108,0x51,"Illegal ASCII table TFORMn code: \'%s\'",in_RDI);
          ffpmsg((char *)0x166f07);
        }
        if (in_RSI != (int *)0x0) {
          *in_RSI = iVar3;
        }
        if (in_RDX != (long *)0x0) {
          *in_RDX = (long)in_stack_ffffffffffffffb8;
        }
        local_4 = *in_R8;
      }
    }
    else {
      ffpmsg((char *)0x166b2d);
      *in_R8 = 0x105;
      local_4 = 0x105;
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffasfm(char *tform,    /* I - format code from the TFORMn keyword */
           int *dtcode,    /* O - numerical datatype code */
           long *twidth,   /* O - width of the field, in chars */
           int *decimals,  /* O - number of decimal places (F, E, D format) */
           int *status)    /* IO - error status      */
{
/*
  parse the ASCII table TFORM column format to determine the data
  type, the field width, and number of decimal places (if relevant)
*/
    int ii, datacode;
    long longval, width;
    float fwidth;
    char *form, temp[FLEN_VALUE], message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (dtcode)
        *dtcode = 0;

    if (twidth)
        *twidth = 0;

    if (decimals)
        *decimals = 0;

    ii = 0;
    while (tform[ii] != 0 && tform[ii] == ' ') /* find first non-blank char */
         ii++;

    if (strlen(&tform[ii]) > FLEN_VALUE-1)
    {
       ffpmsg("Error: ASCII table TFORM code is too long (ffasfm)");
       return(*status = BAD_TFORM);
    }
    strcpy(temp, &tform[ii]); /* copy format string */
    ffupch(temp);     /* make sure it is in upper case */
    form = temp;      /* point to start of format string */


    if (form[0] == 0)
    {
        ffpmsg("Error: ASCII table TFORM code is blank");
        return(*status = BAD_TFORM);
    }

    /*-----------------------------------------------*/
    /*       determine default datatype code         */
    /*-----------------------------------------------*/
    if (form[0] == 'A')
        datacode = TSTRING;
    else if (form[0] == 'I')
        datacode = TLONG;
    else if (form[0] == 'F')
        datacode = TFLOAT;
    else if (form[0] == 'E')
        datacode = TFLOAT;
    else if (form[0] == 'D')
        datacode = TDOUBLE;
    else
    {
        snprintf(message, FLEN_ERRMSG,
                "Illegal ASCII table TFORMn datatype: \'%s\'", tform);
        ffpmsg(message);
        return(*status = BAD_TFORM_DTYPE);
    }

    if (dtcode)
       *dtcode = datacode;

    form++;  /* point to the start of field width */

    if (datacode == TSTRING || datacode == TLONG)
    { 
        /*-----------------------------------------------*/
        /*              A or I data formats:             */
        /*-----------------------------------------------*/

        if (ffc2ii(form, &width, status) <= 0)  /* read the width field */
        {
            if (width <= 0)
            {
                width = 0;
                *status = BAD_TFORM;
            }
            else
            {                
                /* set to shorter precision if I4 or less */
                if (width <= 4 && datacode == TLONG)
                    datacode = TSHORT;
            }
        }
    }
    else
    {  
        /*-----------------------------------------------*/
        /*              F, E or D data formats:          */
        /*-----------------------------------------------*/

        if (ffc2rr(form, &fwidth, status) <= 0) /* read ww.dd width field */
        {
           if (fwidth <= 0.)
            *status = BAD_TFORM;
          else
          {
            width = (long) fwidth;  /* convert from float to long */

            if (width > 7 && *temp == 'F')
                datacode = TDOUBLE;  /* type double if >7 digits */

            if (width < 10)
                form = form + 1; /* skip 1 digit  */
            else
                form = form + 2; /* skip 2 digits */

            if (form[0] == '.') /* should be a decimal point here */
            {
                form++;  /*  point to start of decimals field */

                if (ffc2ii(form, &longval, status) <= 0) /* read decimals */
                {
                    if (decimals)
                        *decimals = longval;  /* long to short convertion */

                    if (longval >= width)  /* width < no. of decimals */
                        *status = BAD_TFORM; 

                    if (longval > 6 && *temp == 'E')
                        datacode = TDOUBLE;  /* type double if >6 digits */
                }
            }

          }
        }
    }
    if (*status > 0)
    {
        *status = BAD_TFORM;
        snprintf(message,FLEN_ERRMSG,"Illegal ASCII table TFORMn code: \'%s\'", tform);
        ffpmsg(message);
    }

    if (dtcode)
       *dtcode = datacode;

    if (twidth)
       *twidth = width;

    return(*status);
}